

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_maps.hpp
# Opt level: O2

void PatchOptimizeMaps::remove_useless_entities(World *world)

{
  Map *pMVar1;
  pointer puVar2;
  initializer_list<unsigned_short> __l;
  allocator_type local_51;
  vector<unsigned_short,_std::allocator<unsigned_short>_> MAPS_TO_CLEAR_ENTITIES_FROM;
  unsigned_short local_38 [16];
  
  local_38[8] = 0x61;
  local_38[9] = 0x40;
  local_38[10] = 0x273;
  local_38[0xb] = 0xaa;
  local_38[0xc] = 0x5e;
  local_38[0] = 0x37;
  local_38[1] = 0x3b;
  local_38[2] = 0x1c6;
  local_38[3] = 0x259;
  local_38[4] = 0x55;
  local_38[5] = 0x23;
  local_38[6] = 0x60;
  local_38[7] = 0x67;
  __l._M_len = 0xd;
  __l._M_array = local_38;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&MAPS_TO_CLEAR_ENTITIES_FROM,__l,&local_51);
  for (puVar2 = MAPS_TO_CLEAR_ENTITIES_FROM.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar2 != MAPS_TO_CLEAR_ENTITIES_FROM.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    pMVar1 = World::map(world,*puVar2);
    Map::clear_entities(pMVar1);
  }
  pMVar1 = World::map(world,0);
  Map::remove_entity(pMVar1,'\a',true);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&MAPS_TO_CLEAR_ENTITIES_FROM.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  return;
}

Assistant:

static void remove_useless_entities(World& world)
    {
        const std::vector<uint16_t> MAPS_TO_CLEAR_ENTITIES_FROM = {
                MAP_MERCATOR_CASTLE_ENTRANCE_HALLWAY,
                MAP_MERCATOR_CASTLE_MAIN_HALL,
                MAP_ROUTE_GUMI_RYUMA_MERCATOR_GATES,
                MAP_GUMI_EXTERIOR,
                MAP_MERCATOR_CASTLE_BANQUET_ROOM,
                MAP_MECATOR_CASTLE_TOWER_SUMMIT,
                MAP_MERCATOR_CASTLE_ZAK_ROOM,
                MAP_MERCATOR_CASTLE_DEXTER_ROOM,
                MAP_MERCATOR_CASTLE_NIGEL_ROOM,
                MAP_MERCATOR_CASTLE_ARMORY_BARRACKS,
                MAP_RYUMA_LIGHTHOUSE, // Base Ryuma lighthouse (before Duke breaks it) is not reachable
                MAP_KN_CAVE_TELEPORTER_TO_KAZALT,
                MAP_MERCATOR_CASTLE_2F_HALLWAY
        };

        for(uint16_t map_id : MAPS_TO_CLEAR_ENTITIES_FROM)
            world.map(map_id)->clear_entities();

        // Remove a useless Miro from a map in Swamp Shrine
        world.map(MAP_SWAMP_SHRINE_0)->remove_entity(7);
    }